

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::printBasicHelp(Args *this)

{
  ostream *poVar1;
  long in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"\nThe following arguments are mandatory:\n");
  poVar1 = std::operator<<(poVar1,"  -input              training file path\n");
  poVar1 = std::operator<<(poVar1,"  -weights            weights file path (binary)\n");
  poVar1 = std::operator<<(poVar1,"  -output             output file path\n");
  poVar1 = std::operator<<(poVar1,"\nThe following arguments are optional:\n");
  poVar1 = std::operator<<(poVar1,"  -verbose            verbosity level [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xe8));
  std::operator<<(poVar1,"]\n");
  return;
}

Assistant:

void Args::printBasicHelp() {
  std::cerr << "\nThe following arguments are mandatory:\n"
            << "  -input              training file path\n"
            << "  -weights            weights file path (binary)\n"
            << "  -output             output file path\n"
            << "\nThe following arguments are optional:\n"
            << "  -verbose            verbosity level [" << verbose << "]\n";
}